

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O2

ostream * __thiscall bsim::unsigned_int<17>::print(unsigned_int<17> *this,ostream *out)

{
  int i;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 0x10;
  while (uVar1 = (uint)uVar2, -1 < (int)uVar1) {
    pcVar3 = "0";
    if (((this->bits).bits[uVar2 >> 3] >> (uVar1 & 7) & 1) != 0) {
      pcVar3 = "1";
    }
    std::operator<<(out,pcVar3);
    uVar2 = (ulong)(uVar1 - 1);
  }
  std::operator<<(out,"U");
  return out;
}

Assistant:

inline std::ostream& print(std::ostream& out) const {
      out << bits << "U";
      return out;
    }